

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrDEC0xd6(CPU *this)

{
  Memory *this_00;
  uint8_t uVar1;
  uint16_t addr;
  
  addr = zeropage_x_addr_j(this);
  this_00 = this->m;
  uVar1 = Memory::Read8(this_00,addr);
  uVar1 = DEC(this,uVar1);
  Memory::Write8(this_00,addr,uVar1);
  return 6;
}

Assistant:

int CPU::instrDEC0xd6() {
	uint16_t address = zeropage_x_addr_j();
	m->Write8(address, DEC(m->Read8(address)));
	return 6;
}